

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O3

confirm * __thiscall
lest::for_test<lest::confirm>(lest *this,tests *specification,texts *in,confirm *perform,int n)

{
  bool bVar1;
  long *plVar2;
  int iVar3;
  confirm *pcVar4;
  int iVar5;
  fd_set *__exceptfds;
  fd_set *__writefds;
  undefined4 in_register_00000084;
  long *plVar6;
  int local_c8;
  long *local_b8 [2];
  long local_a8 [2];
  lest *local_98;
  tests *local_90;
  test local_88;
  
  iVar5 = (int)perform;
  __exceptfds = (fd_set *)CONCAT71((int7)((ulong)perform >> 8),iVar5 < 1);
  if (iVar5 == -1 || iVar5 >= 1) {
    local_c8 = 0;
    local_98 = this;
    local_90 = specification;
    do {
      plVar2 = *(long **)(local_98 + 8);
      for (plVar6 = *(long **)local_98; plVar6 != plVar2; plVar6 = plVar6 + 8) {
        local_b8[0] = local_a8;
        std::__cxx11::string::_M_construct<char*>((string *)local_b8,*plVar6,plVar6[1] + *plVar6);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&stack0xffffffffffffffb8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_90);
        iVar3 = select((int)(string *)local_b8,(fd_set *)&stack0xffffffffffffffb8,__writefds,
                       __exceptfds,(timeval *)CONCAT44(in_register_00000084,n));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&stack0xffffffffffffffb8);
        if (local_b8[0] != local_a8) {
          operator_delete(local_b8[0],local_a8[0] + 1);
        }
        if ((char)iVar3 != '\0') {
          local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
          std::__cxx11::string::_M_construct<char*>((string *)&local_88,*plVar6,plVar6[1] + *plVar6)
          ;
          std::function<void_(lest::env_&)>::function
                    (&local_88.behaviour,(function<void_(lest::env_&)> *)(plVar6 + 4));
          pcVar4 = confirm::operator()((confirm *)in,&local_88);
          iVar3 = pcVar4->failures;
          bVar1 = (pcVar4->output).opt.abort;
          if (local_88.behaviour.super__Function_base._M_manager != (_Manager_type)0x0) {
            (*local_88.behaviour.super__Function_base._M_manager)
                      ((_Any_data *)&local_88.behaviour,(_Any_data *)&local_88.behaviour,
                       __destroy_functor);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88.name._M_dataplus._M_p != &local_88.name.field_2) {
            operator_delete(local_88.name._M_dataplus._M_p,
                            local_88.name.field_2._M_allocated_capacity + 1);
          }
          if ((0 < iVar3 & bVar1) != 0) {
            return (confirm *)in;
          }
        }
      }
      local_c8 = local_c8 + 1;
      __exceptfds = (fd_set *)
                    (ulong)CONCAT31((int3)((ulong)perform >> 8),iVar5 <= local_c8 && iVar5 != -1);
    } while (iVar5 > local_c8 || iVar5 == -1);
  }
  return (confirm *)in;
}

Assistant:

Action && for_test( tests specification, texts in, Action && perform, int n = 1 )
{
    for ( int i = 0; indefinite( n ) || i < n; ++i )
    {
        for ( auto & testing : specification )
        {
            if ( select( testing.name, in ) )
                if ( abort( perform( testing ) ) )
                    return std::move( perform );
        }
    }
    return std::move( perform );
}